

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pyraminx.cpp
# Opt level: O1

void __thiscall Pyraminx::scramble(Pyraminx *this,int depth)

{
  result_type layer;
  Corner corner;
  Direction dir;
  uniform_int_distribution<int> dir_dist;
  uniform_int_distribution<int> corner_layer_dist;
  random_device generator;
  param_type local_13c8;
  param_type local_13c0;
  random_device local_13b8;
  
  std::random_device::random_device(&local_13b8);
  local_13c0._M_a = 0;
  local_13c0._M_b = 3;
  local_13c8._M_a = 0;
  local_13c8._M_b = 1;
  if (0 < depth) {
    do {
      layer = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_13c0,&local_13b8,&local_13c0);
      corner = std::uniform_int_distribution<int>::operator()
                         ((uniform_int_distribution<int> *)&local_13c0,&local_13b8,&local_13c0);
      dir = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_13c8,&local_13b8,&local_13c8);
      turn_layer(this,corner,layer,dir);
      depth = depth + -1;
    } while (depth != 0);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

void Pyraminx::scramble(int depth){
    std::random_device generator;
    std::uniform_int_distribution<int> corner_layer_dist(0, 3);
    std::uniform_int_distribution<int> dir_dist(0, 1);

    // Some help here from zildjohn01, cc by-sa 
    // https://stackoverflow.com/questions/2999012/generating-random-enums
    // Tip is to use static_cast to castrandom int to an enum
    // That way I can randomly choose a corner and direction.
    for(int i = 0; i < depth; i++){
        int random_layer = corner_layer_dist(generator);
        Corner random_corner = static_cast<Corner>(corner_layer_dist(generator));
        Direction random_direction = static_cast<Direction>(dir_dist(generator));
        turn_layer(random_corner, random_layer, random_direction);
    }
}